

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeDoubleRegStore(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint64_t Address_00;
  uint64_t Address_01;
  
  DVar1 = DecodeGPRnopcRegisterClass(Inst,Insn >> 0xc & 0xf,Address,Decoder);
  if ((DVar1 | 2) == MCDisassembler_Success) {
    DVar1 = DecodeGPRPairRegisterClass(Inst,Insn & 0xf,0,Decoder);
    if (((DVar1 == MCDisassembler_Success) || (DVar1 == MCDisassembler_SoftFail)) &&
       ((DVar1 = DecodeGPRRegisterClass(Inst,Insn >> 0x10 & 0xf,Address_00,Decoder),
        DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) {
      DVar1 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_01,Decoder);
      DVar1 = (*(code *)(&DAT_001cc25c + *(int *)(&DAT_001cc25c + (ulong)DVar1 * 4)))();
      return DVar1;
    }
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeDoubleRegStore(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 12, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;

	if (Rn == 0xF || Rd == Rn || Rd == Rt || Rd == Rt+1)
		S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRPairRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}